

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O3

TPM_RC TSS_Create(TSS_DEVICE *tpm,TSS_SESSION *sess,TPM_HANDLE parent,
                 TPM2B_SENSITIVE_CREATE *sensCreate,TPM2B_PUBLIC *inPub,TPM2B_PRIVATE *outPriv,
                 TPM2B_PUBLIC *outPub)

{
  TPM_RC TVar1;
  TPML_PCR_SELECTION creationPCR;
  TPM2B_DATA outsideInfo;
  TPM2B_SENSITIVE_CREATE locSensCreate;
  TPML_PCR_SELECTION local_168;
  TPM2B_DATA local_148;
  TPM2B_SENSITIVE_CREATE local_fa;
  
  memset(&local_fa,0,0xca);
  local_148._48_8_ = 0;
  local_148._56_8_ = 0;
  local_148._32_8_ = 0;
  local_148._40_8_ = 0;
  local_148._16_8_ = 0;
  local_148._24_8_ = 0;
  local_148._0_8_ = 0;
  local_148._8_8_ = 0;
  local_148._64_4_ = 0;
  local_168.pcrSelections[2].hash = 0;
  local_168.pcrSelections[2].sizeofSelect = '\0';
  local_168.pcrSelections[2].pcrSelect[0] = '\0';
  local_168.pcrSelections[2].pcrSelect[1] = '\0';
  local_168.pcrSelections[2].pcrSelect[2] = '\0';
  local_168.pcrSelections[3].hash = 0;
  local_168.pcrSelections[3].sizeofSelect = '\0';
  local_168.pcrSelections[3].pcrSelect[0] = '\0';
  local_168.pcrSelections[3].pcrSelect[1] = '\0';
  local_168.pcrSelections[3].pcrSelect[2] = '\0';
  local_168.count = 0;
  local_168.pcrSelections[0].hash = 0;
  local_168.pcrSelections[0].sizeofSelect = '\0';
  local_168.pcrSelections[0].pcrSelect[0] = '\0';
  local_168.pcrSelections[0].pcrSelect[1] = '\0';
  local_168.pcrSelections[0].pcrSelect[2] = '\0';
  local_168.pcrSelections[1].hash = 0;
  local_168.pcrSelections[1].sizeofSelect = '\0';
  local_168.pcrSelections[1].pcrSelect[0] = '\0';
  local_168.pcrSelections[1].pcrSelect[1] = '\0';
  local_168.pcrSelections[1].pcrSelect[2] = '\0';
  if (sensCreate == (TPM2B_SENSITIVE_CREATE *)0x0) {
    sensCreate = &local_fa;
  }
  TVar1 = TPM2_Create(tpm,sess,parent,sensCreate,inPub,&local_148,&local_168,outPriv,outPub,
                      (TPM2B_CREATION_DATA *)0x0,(TPM2B_DIGEST *)0x0,(TPMT_TK_CREATION *)0x0);
  return TVar1;
}

Assistant:

TPM_RC TSS_Create(TSS_DEVICE *tpm, TSS_SESSION* sess, TPM_HANDLE parent, TPM2B_SENSITIVE_CREATE *sensCreate,
    TPM2B_PUBLIC *inPub, TPM2B_PRIVATE *outPriv, TPM2B_PUBLIC *outPub)
{
    TPM2B_SENSITIVE_CREATE  locSensCreate = { 0 };
    TPM2B_DATA              outsideInfo = { {0} };
    TPML_PCR_SELECTION      creationPCR = { 0 };

    return TPM2_Create(tpm, sess, parent,
        sensCreate ? sensCreate : &locSensCreate,
        inPub, &outsideInfo, &creationPCR,
        outPriv, outPub, NULL, NULL, NULL);
}